

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O1

FSerializer * __thiscall
FSerializer::Array<TObjPtr<DFsScript>>
          (FSerializer *this,char *key,TObjPtr<DFsScript> *obj,int count,bool fullcompare)

{
  char *pcVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  
  if (((!save_full) && (fullcompare)) && (this->w != (FWriter *)0x0)) {
    bVar5 = count == 0;
    if ((!bVar5) && (*(char *)&obj->field_0 == '\0')) {
      lVar3 = 1;
      do {
        bVar5 = (long)count * 8 == lVar3;
        if (bVar5) break;
        pcVar1 = (char *)((long)&obj->field_0 + lVar3);
        lVar3 = lVar3 + 1;
      } while (*pcVar1 == '\0');
    }
    if (bVar5) {
      return this;
    }
  }
  bVar5 = BeginArray(this,key);
  if (bVar5) {
    if ((this->r != (FReader *)0x0) && (uVar2 = ArraySize(this), (int)uVar2 < count)) {
      count = uVar2;
    }
    if (0 < count) {
      uVar4 = (ulong)(uint)count;
      do {
        ::Serialize(this,(char *)0x0,(DObject **)obj,(DObject **)0x0,(bool *)0x0);
        obj = obj + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    EndArray(this);
  }
  return this;
}

Assistant:

FSerializer &Array(const char *key, T *obj, int count, bool fullcompare = false)
	{
		if (!save_full && fullcompare && isWriting() && nullcmp(obj, count * sizeof(T)))
		{
			return *this;
		}

		if (BeginArray(key))
		{
			if (isReading())
			{
				int max = ArraySize();
				if (max < count) count = max;
			}
			for (int i = 0; i < count; i++)
			{
				Serialize(*this, nullptr, obj[i], (T*)nullptr);
			}
			EndArray();
		}
		return *this;
	}